

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall PhPacker_Arg_s_Test::TestBody(PhPacker_Arg_s_Test *this)

{
  bool bVar1;
  short sVar2;
  char *pcVar3;
  AssertHelper local_190;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_3;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  string local_110;
  uint local_ec;
  AssertHelper local_e8;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_c0 [6];
  int16_t expected;
  short local_aa;
  undefined1 local_a8 [6];
  int16_t result;
  string str;
  Message local_80;
  int local_74;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  any local_50;
  short local_3a;
  undefined1 local_38 [6];
  int16_t res;
  string s;
  int16_t val;
  PhPacker_Arg_s_Test *this_local;
  
  s.field_2._14_2_ = 0x7b;
  PhPacker::pack<short,_0>((string *)local_38,'s',0x7b);
  PhPacker::unpack((PhPacker *)&local_50,'s',(string *)local_38);
  sVar2 = std::any_cast<short>(&local_50);
  std::any::~any(&local_50);
  local_74 = 0x7b;
  local_3a = sVar2;
  testing::internal::EqHelper::Compare<short,_int,_nullptr>
            ((EqHelper *)local_70,"res","123",&local_3a,&local_74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&str.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&str.field_2 + 8),&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&str.field_2 + 8));
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  PhPacker::pack<short,_0>((string *)local_a8,'s',0x28f);
  PhPacker::unpack((PhPacker *)local_c0,'s',(string *)local_a8);
  sVar2 = std::any_cast<short>((any *)local_c0);
  std::any::~any((any *)local_c0);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_2_ = 0x28f;
  local_aa = sVar2;
  testing::internal::EqHelper::Compare<short,_short,_nullptr>
            ((EqHelper *)local_d8,"result","expected",&local_aa,
             (short *)((long)&gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 6));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  local_ec = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  if (local_ec == 0) {
    sVar2 = std::numeric_limits<short>::max();
    PhPacker::pack<short,_0>(&local_110,'s',sVar2);
    std::__cxx11::string::operator=((string *)local_a8,(string *)&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    PhPacker::unpack((PhPacker *)&gtest_ar_2.message_,'s',(string *)local_a8);
    local_aa = std::any_cast<short>((any *)&gtest_ar_2.message_);
    std::any::~any((any *)&gtest_ar_2.message_);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._6_2_ = std::numeric_limits<short>::max();
    testing::internal::EqHelper::Compare<short,_short,_nullptr>
              ((EqHelper *)local_130,"result","expected",&local_aa,
               (short *)((long)&gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 6));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0x28,pcVar3);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      testing::Message::~Message(&local_138);
    }
    local_ec = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
    if (local_ec == 0) {
      sVar2 = std::numeric_limits<short>::min();
      PhPacker::pack<short,_0>(&local_160,'s',sVar2);
      std::__cxx11::string::operator=((string *)local_a8,(string *)&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      PhPacker::unpack((PhPacker *)&gtest_ar_3.message_,'s',(string *)local_a8);
      local_aa = std::any_cast<short>((any *)&gtest_ar_3.message_);
      std::any::~any((any *)&gtest_ar_3.message_);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._6_2_ = std::numeric_limits<short>::min();
      testing::internal::EqHelper::Compare<short,_short,_nullptr>
                ((EqHelper *)local_180,"result","expected",&local_aa,
                 (short *)((long)&gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          + 6));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
      if (!bVar1) {
        testing::Message::Message(&local_188);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                   ,0x2d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_190,&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        testing::Message::~Message(&local_188);
      }
      local_ec = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
      if (local_ec == 0) {
        local_ec = 0;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST(PhPacker, Arg_s)
{
    int16_t val = 123;
    auto s = PhPacker::pack<short>('s', val);
    int16_t res = std::any_cast<short>(PhPacker::unpack('s', s));
    EXPECT_EQ(res, 123);

    std::string str = PhPacker::pack<short>('s', int16_t{655});
    int16_t result = std::any_cast<short>(PhPacker::unpack('s', str));
    int16_t expected = 655;
    GTEST_ASSERT_EQ(result, expected);

    str = PhPacker::pack<int16_t>('s', std::numeric_limits<int16_t>::max());
    result = std::any_cast<int16_t>(PhPacker::unpack('s', str));
    expected = std::numeric_limits<int16_t>::max();
    GTEST_ASSERT_EQ(result, expected);

    str = PhPacker::pack<int16_t>('s', std::numeric_limits<int16_t>::min());
    result = std::any_cast<int16_t>(PhPacker::unpack('s', str));
    expected = std::numeric_limits<int16_t>::min();
    GTEST_ASSERT_EQ(result, expected);
}